

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

boolean jtransform_perfect_transform
                  (JDIMENSION image_width,JDIMENSION image_height,int MCU_width,int MCU_height,
                  JXFORM_CODE transform)

{
  boolean result;
  JXFORM_CODE transform_local;
  int MCU_height_local;
  int MCU_width_local;
  JDIMENSION image_height_local;
  JDIMENSION image_width_local;
  
  if (transform == JXFORM_FLIP_H) {
LAB_00182773:
    result = (boolean)(image_width % (uint)MCU_width == 0);
    return result;
  }
  if (transform == JXFORM_FLIP_V) {
LAB_0018278c:
    result = (boolean)(image_height % (uint)MCU_height == 0);
  }
  else {
    if (transform != JXFORM_TRANSVERSE) {
      if (transform == JXFORM_ROT_90) goto LAB_0018278c;
      if (transform != JXFORM_ROT_180) {
        if (transform != JXFORM_ROT_270) {
          return 1;
        }
        goto LAB_00182773;
      }
    }
    result = (boolean)(image_width % (uint)MCU_width == 0);
    if (image_height % (uint)MCU_height != 0) {
      result = 0;
    }
  }
  return result;
}

Assistant:

GLOBAL(boolean)
jtransform_perfect_transform(JDIMENSION image_width, JDIMENSION image_height,
                             int MCU_width, int MCU_height,
                             JXFORM_CODE transform)
{
  boolean result = TRUE; /* initialize TRUE */

  switch (transform) {
  case JXFORM_FLIP_H:
  case JXFORM_ROT_270:
    if (image_width % (JDIMENSION)MCU_width)
      result = FALSE;
    break;
  case JXFORM_FLIP_V:
  case JXFORM_ROT_90:
    if (image_height % (JDIMENSION)MCU_height)
      result = FALSE;
    break;
  case JXFORM_TRANSVERSE:
  case JXFORM_ROT_180:
    if (image_width % (JDIMENSION)MCU_width)
      result = FALSE;
    if (image_height % (JDIMENSION)MCU_height)
      result = FALSE;
    break;
  default:
    break;
  }

  return result;
}